

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.h
# Opt level: O0

ssize_t __thiscall
wasm::LEB<int,_signed_char>::write(LEB<int,_signed_char> *this,int __fd,void *__buf,size_t __n)

{
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  byte local_1e;
  byte local_1d;
  int local_1c;
  uint8_t byte;
  bool more;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvStack_18;
  int temp;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *out_local;
  LEB<int,_signed_char> *this_local;
  
  pvStack_18 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_register_00000034,__fd);
  local_1c = this->value;
  out_local = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)this;
  do {
    local_1e = (byte)local_1c & 0x7f;
    local_1c = local_1c >> 7;
    local_1d = hasMore(this,local_1c,local_1e);
    if ((bool)local_1d) {
      local_1e = local_1e | 0x80;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(pvStack_18,&local_1e);
  } while ((local_1d & 1) != 0);
  return extraout_RAX;
}

Assistant:

void write(std::vector<uint8_t>* out) {
    T temp = value;
    bool more;
    do {
      uint8_t byte = temp & 127;
      temp >>= 7;
      more = hasMore(temp, byte);
      if (more) {
        byte = byte | 128;
      }
      out->push_back(byte);
    } while (more);
  }